

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterInvocationTestCase::
genBarrierSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  ostringstream *this_00;
  char *pcVar2;
  ostringstream buf;
  ostream local_190;
  
  this_00 = (ostringstream *)&local_190;
  std::__cxx11::ostringstream::ostringstream(this_00);
  if (*(char *)((long)this + 0x7e) == '\x01') {
    poVar1 = std::operator<<(&local_190,"\n");
    poVar1 = std::operator<<(poVar1,"\tgroupMemoryBarrier();\n");
    pcVar2 = "\tbarrier();\n";
LAB_01282bc4:
    this_00 = (ostringstream *)std::operator<<(poVar1,pcVar2);
  }
  else if (*(int *)((long)this + 0x78) != 0) {
    if (*(int *)((long)this + 0x78) != 1) goto LAB_01282bde;
    poVar1 = std::operator<<(&local_190,"\n");
    pcVar2 = "\tmemoryBarrierImage();\n";
    goto LAB_01282bc4;
  }
  std::operator<<((ostream *)this_00,"\n");
LAB_01282bde:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string InterInvocationTestCase::genBarrierSource (void) const
{
	std::ostringstream buf;

	if (m_syncWithGroup)
	{
		// Wait until all invocations in this work group have their texture/buffer read/write operations complete
		// \note We could also use memoryBarrierBuffer() or memoryBarrierImage() in place of groupMemoryBarrier() but
		//       we only require intra-workgroup synchronization.
		buf << "\n"
			<< "	groupMemoryBarrier();\n"
			<< "	barrier();\n"
			<< "\n";
	}
	else if (m_storage == STORAGE_BUFFER)
	{
		DE_ASSERT(!m_syncWithGroup);

		// Waiting only for data written by this invocation. Since all buffer reads and writes are
		// processed in order (within a single invocation), we don't have to do anything.
		buf << "\n";
	}
	else if (m_storage == STORAGE_IMAGE)
	{
		DE_ASSERT(!m_syncWithGroup);

		// Waiting only for data written by this invocation. But since operations complete in undefined
		// order, we have to wait for them to complete.
		buf << "\n"
			<< "	memoryBarrierImage();\n"
			<< "\n";
	}
	else
		DE_ASSERT(DE_FALSE);

	return buf.str();
}